

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int wally_tx_get_witness_count(wally_tx *tx,size_t *written)

{
  wally_tx_input *pwVar1;
  wally_tx_output *pwVar2;
  _Bool _Var3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  _Var3 = is_valid_tx(tx);
  if (_Var3 && written != (size_t *)0x0) {
    lVar5 = 200;
    for (uVar6 = 0; uVar6 < tx->num_inputs; uVar6 = uVar6 + 1) {
      pwVar1 = tx->inputs;
      if (*(long *)((long)pwVar1 + lVar5 + -0x90) != 0) {
        *written = *written + 1;
      }
      if (*(long *)(pwVar1->txhash + lVar5 + -0x18) != 0) {
        *written = *written + 1;
      }
      if (*(long *)(pwVar1->txhash + lVar5 + -8) != 0) {
        *written = *written + 1;
      }
      if (*(long *)(pwVar1->txhash + lVar5) != 0) {
        *written = *written + 1;
      }
      lVar5 = lVar5 + 0xd0;
    }
    lVar5 = 0x68;
    iVar4 = 0;
    for (uVar6 = 0; uVar6 < tx->num_outputs; uVar6 = uVar6 + 1) {
      pwVar2 = tx->outputs;
      if (*(long *)((long)pwVar2 + lVar5 + -0x10) != 0) {
        *written = *written + 1;
      }
      if (*(long *)((long)&pwVar2->satoshi + lVar5) != 0) {
        *written = *written + 1;
      }
      lVar5 = lVar5 + 0x70;
    }
  }
  else {
    iVar4 = -2;
  }
  return iVar4;
}

Assistant:

int wally_tx_get_witness_count(const struct wally_tx *tx, size_t *written)
{
    size_t i;

    if (written)
        *written = 0;

    if (!is_valid_tx(tx) || !written)
        return WALLY_EINVAL;

    for (i = 0; i < tx->num_inputs; ++i) {
        if (tx->inputs[i].witness)
            *written += 1;
#ifdef BUILD_ELEMENTS
        /* TODO: check the count in the presence of a mix of NULL and non-NULL witnesses */
        if (tx->inputs[i].issuance_amount_rangeproof_len)
            *written += 1;
        if (tx->inputs[i].inflation_keys_rangeproof_len)
            *written += 1;
        if (tx->inputs[i].pegin_witness)
            *written += 1;
#endif
    }

#ifdef BUILD_ELEMENTS
    /* TODO: check the count in the presence of a mix of NULL and non-NULL witnesses */
    for (i = 0; i < tx->num_outputs; ++i) {
        if (tx->outputs[i].surjectionproof_len)
            *written += 1;
        if (tx->outputs[i].rangeproof_len)
            *written += 1;
    }
#endif

    return WALLY_OK;
}